

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O0

Col_Word Col_StringBufferFreeze(Col_Word strbuf)

{
  byte bVar1;
  Col_Char1 *pCVar2;
  uint uVar3;
  Col_Char1 *pCVar4;
  uint local_5c;
  uint local_58;
  uint local_54;
  byte *local_50;
  Col_Char2 *data2;
  Col_Char1 *data1;
  size_t i;
  Col_Char4 *data;
  int pinned;
  size_t length;
  byte *pbStack_18;
  Col_StringFormat format;
  Col_Word strbuf_local;
  
  if (strbuf == 0) {
    local_54 = 0;
  }
  else {
    if ((strbuf & 0xf) == 0) {
      if ((*(byte *)strbuf & 2) == 0) {
        local_5c = 0xffffffff;
      }
      else {
        local_5c = *(byte *)strbuf & 0xfffffffe;
      }
      local_58 = local_5c;
    }
    else {
      local_58 = immediateWordTypes[strbuf & 0x1f];
    }
    local_54 = local_58;
  }
  pbStack_18 = (byte *)strbuf;
  if ((local_54 == 2) && ((*(ushort *)(strbuf + 2) & 0xc) == 0)) {
    pbStack_18 = *(byte **)(strbuf + 0x10);
  }
  pCVar2 = *(Col_Char1 **)(pbStack_18 + 0x10);
  if ((pCVar2 == (Col_Char1 *)0x0) || (*(long *)(pbStack_18 + 8) != 0xc)) {
    strbuf_local = Col_StringBufferValue((Col_Word)pbStack_18);
  }
  else {
    bVar1 = *pbStack_18;
    uVar3 = (uint)(char)pbStack_18[1];
    if ((uVar3 - 1 < 2) || (uVar3 == 4)) {
      pCVar4 = (Col_Char1 *)0x1;
      if (uVar3 == 1) {
        pCVar4 = (Col_Char1 *)0x7;
      }
      if ((pCVar4 < pCVar2) && (pCVar2 < (Col_Char1 *)0x10000)) {
        *pbStack_18 = 6;
        pbStack_18[1] = pbStack_18[1];
        *(short *)(pbStack_18 + 2) = (short)pCVar2;
        if ((bVar1 & 1) != 0) {
          *pbStack_18 = *pbStack_18 | 1;
        }
        memcpy(pbStack_18 + 4,pbStack_18 + 0x18,(long)pCVar2 * (ulong)(uVar3 & 7));
        return (Col_Word)pbStack_18;
      }
    }
    else if ((uVar3 == 0x24) && (pCVar2 < (Col_Char1 *)0x10000)) {
      i = (size_t)(pbStack_18 + 0x18);
      length._4_4_ = 1;
      for (data1 = (Col_Char1 *)0x0; data1 < pCVar2; data1 = data1 + 1) {
        if (0xffff < *(uint *)(i + (long)data1 * 4)) {
          length._4_4_ = 4;
          break;
        }
        if (0xff < *(uint *)(i + (long)data1 * 4)) {
          length._4_4_ = 2;
        }
      }
      pCVar4 = (Col_Char1 *)0x1;
      if (length._4_4_ == 1) {
        pCVar4 = (Col_Char1 *)0x7;
      }
      if (pCVar4 < pCVar2) {
        *pbStack_18 = 6;
        pbStack_18[1] = (byte)length._4_4_;
        *(short *)(pbStack_18 + 2) = (short)pCVar2;
        if ((bVar1 & 1) != 0) {
          *pbStack_18 = *pbStack_18 | 1;
        }
        if (length._4_4_ == 1) {
          data2 = (Col_Char2 *)(pbStack_18 + 4);
          for (data1 = (Col_Char1 *)0x0; data1 < pCVar2; data1 = data1 + 1) {
            *(char *)data2 = (char)*(undefined4 *)i;
            data2 = (Col_Char2 *)((long)data2 + 1);
            i = i + 4;
          }
        }
        else if (length._4_4_ == 2) {
          local_50 = pbStack_18 + 4;
          for (data1 = (Col_Char1 *)0x0; data1 < pCVar2; data1 = data1 + 1) {
            *(short *)local_50 = (short)*(undefined4 *)i;
            local_50 = local_50 + 2;
            i = i + 4;
          }
        }
        else {
          memcpy(pbStack_18 + 4,pbStack_18 + 0x18,(long)pCVar2 * (ulong)length._4_4_);
        }
        return (Col_Word)pbStack_18;
      }
    }
    strbuf_local = Col_StringBufferValue((Col_Word)pbStack_18);
  }
  return strbuf_local;
}

Assistant:

Col_Word
Col_StringBufferFreeze(
    Col_Word strbuf)    /*!< String buffer to freeze. */
{
    Col_StringFormat format;
    size_t length;
    int pinned;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return WORD_NIL;

    WORD_UNWRAP(strbuf);

    length = WORD_STRBUF_LENGTH(strbuf);
    if (length == 0 || WORD_STRBUF_ROPE(strbuf) != WORD_SMALLSTR_EMPTY) {
        /*
         * Buffer is empty or accumulated rope is not, return value.
         */

        return Col_StringBufferValue(strbuf);
    }

    /*
     * Turn word into rope.
     */

    pinned = WORD_PINNED(strbuf);
    format = (Col_StringFormat) WORD_STRBUF_FORMAT(strbuf);
    switch (format) {
    case COL_UCS1:
    case COL_UCS2:
    case COL_UCS4:
        if (length > (format == COL_UCS1 ? SMALLSTR_MAX_LENGTH : 1)
                && length <= UCSSTR_MAX_LENGTH) {
            /*
             * Convert word in-place.
             */

            ASSERT(UCSSTR_HEADER_SIZE <= STRBUF_HEADER_SIZE);
            WORD_UCSSTR_INIT(strbuf, format, length);
            if (pinned) {
                WORD_SET_PINNED(strbuf);
            }
            memcpy((void *) WORD_UCSSTR_DATA(strbuf),
                    WORD_STRBUF_BUFFER(strbuf),
                    length * CHAR_WIDTH(format));
            return strbuf;
        }
        break;

    case COL_UCS:
        if (length <= UCSSTR_MAX_LENGTH) {
            /*
             * Compute format.
             */

            Col_Char4 *data = (Col_Char4 *) WORD_STRBUF_BUFFER(strbuf);
            size_t i;
            format = COL_UCS1;
            for (i=0; i < length; i++) {
                if (data[i] > COL_CHAR2_MAX) {
                    format = COL_UCS4;
                    break;
                } else if (data[i] > COL_CHAR1_MAX) {
                    format = COL_UCS2;
                }
            }

            if (length <= (format == COL_UCS1 ? SMALLSTR_MAX_LENGTH : 1)) {
                /*
                 * Fits immediate string.
                 */

                break;
            }

            /*
             * Convert word in-place.
             */

            ASSERT(UCSSTR_HEADER_SIZE <= STRBUF_HEADER_SIZE);
            WORD_UCSSTR_INIT(strbuf, format, length);
            if (pinned) {
                WORD_SET_PINNED(strbuf);
            }
            if (format == COL_UCS1) {
                Col_Char1 *data1 = (Col_Char1 *) WORD_UCSSTR_DATA(strbuf);
                for (i=0; i < length; i++) {
                    *data1++ = *data++;
                }
            } else if (format == COL_UCS2) {
                Col_Char2 *data2 = (Col_Char2 *) WORD_UCSSTR_DATA(strbuf);
                for (i=0; i < length; i++) {
                    *data2++ = *data++;
                }
            } else {
                ASSERT(format == COL_UCS4);
                memcpy((void *) WORD_UCSSTR_DATA(strbuf),
                        WORD_STRBUF_BUFFER(strbuf),
                        length * CHAR_WIDTH(format));
            }
            return strbuf;
        }
        break;
    }

    /*
     * Could not convert in-place (either too large or fits immediate word),
     * return value.
     */

    return Col_StringBufferValue(strbuf);
}